

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void kj::_::Debug::log<char_const(&)[91],unsigned_long_long,unsigned_long>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [91],
               unsigned_long_long *params_1,unsigned_long *params_2)

{
  undefined4 in_register_00000014;
  unsigned_long_long *params_00;
  unsigned_long *params_01;
  long lVar1;
  ArrayPtr<kj::String> in_stack_ffffffffffffff88;
  String local_60;
  String local_48;
  
  str<char_const(&)[91]>
            ((String *)&stack0xffffffffffffff88,(kj *)params,
             (char (*) [91])CONCAT44(in_register_00000014,severity));
  str<unsigned_long_long&>(&local_60,(kj *)params_1,params_00);
  str<unsigned_long&>(&local_48,(kj *)params_2,params_01);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              &stack0xffffffffffffff88,in_stack_ffffffffffffff88);
  lVar1 = 0x30;
  do {
    Array<char>::~Array((Array<char> *)(&stack0xffffffffffffff88 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}